

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortrclut_p.h
# Opt level: O0

QRgb __thiscall QColorTrcLut::fromLinear64(QColorTrcLut *this,QRgba64 rgb64)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  long lVar3;
  type puVar4;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  int bidx;
  int gidx;
  int ridx;
  __m128i vidx;
  __m128i v;
  size_t __i;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined2 local_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  local_e8 = (ushort)in_RSI;
  uStack_e6 = (ushort)((ulong)in_RSI >> 0x10);
  uStack_e4 = (ushort)((ulong)in_RSI >> 0x20);
  uStack_e2 = (ushort)((ulong)in_RSI >> 0x30);
  local_148._0_4_ = CONCAT22(uStack_e6 - (uStack_e6 >> 8),local_e8 - (local_e8 >> 8));
  local_148 = CONCAT26(uStack_e2 - (uStack_e2 >> 8),
                       CONCAT24(uStack_e4 - (uStack_e4 >> 8),(QRgb)local_148));
  uStack_140 = (unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)0x0;
  puVar4 = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::operator[]
                     ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)0x0,
                      local_148);
  uVar1 = *puVar4;
  __i = local_148;
  puVar4 = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::operator[]
                     (uStack_140,local_148);
  uVar2 = *puVar4;
  puVar4 = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::operator[]
                     (uStack_140,__i);
  uVar8 = (short)(local_148 >> 0x30) + 0x80;
  uVar5 = (ushort)(*puVar4 + 0x80) >> 8;
  uVar6 = (ushort)(uVar2 + 0x80) >> 8;
  uVar7 = (ushort)(uVar1 + 0x80) >> 8;
  uVar9 = uVar8 >> 8;
  local_148._0_4_ =
       CONCAT13((uVar9 != 0) * (uVar9 < 0x100) * (char)(uVar8 >> 8) - (0xff < uVar9),
                CONCAT12((uVar7 != 0) * (uVar7 < 0x100) * (char)((ushort)(uVar1 + 0x80) >> 8) -
                         (0xff < uVar7),
                         CONCAT11((uVar6 != 0) * (uVar6 < 0x100) *
                                  (char)((ushort)(uVar2 + 0x80) >> 8) - (0xff < uVar6),
                                  (uVar5 != 0) * (uVar5 < 0x100) *
                                  (char)((ushort)(*puVar4 + 0x80) >> 8) - (0xff < uVar5))));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return (QRgb)local_148;
  }
  __stack_chk_fail();
}

Assistant:

QRgb fromLinear64(QRgba64 rgb64) const
    {
#if defined(__SSE2__)
        __m128i v = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(&rgb64));
        v = _mm_sub_epi16(v, _mm_srli_epi16(v, 8));
        const __m128i vidx = _mm_srli_epi16(v, ShiftDown);
        const int ridx = _mm_extract_epi16(vidx, 0);
        const int gidx = _mm_extract_epi16(vidx, 1);
        const int bidx = _mm_extract_epi16(vidx, 2);
        v = _mm_insert_epi16(v, m_fromLinear[ridx], 2);
        v = _mm_insert_epi16(v, m_fromLinear[gidx], 1);
        v = _mm_insert_epi16(v, m_fromLinear[bidx], 0);
        v = _mm_add_epi16(v, _mm_set1_epi16(0x80));
        v = _mm_srli_epi16(v, 8);
        v = _mm_packus_epi16(v, v);
        return _mm_cvtsi128_si32(v);
#elif defined(__ARM_NEON__) && Q_BYTE_ORDER == Q_LITTLE_ENDIAN
        uint16x4_t v = vreinterpret_u16_u64(vmov_n_u64(rgb64));
        v = vsub_u16(v, vshr_n_u16(v, 8));
        const uint16x4_t vidx = vshr_n_u16(v, ShiftDown);
        const int ridx = vget_lane_u16(vidx, 0);
        const int gidx = vget_lane_u16(vidx, 1);
        const int bidx = vget_lane_u16(vidx, 2);
        v = vset_lane_u16(m_fromLinear[ridx], v, 2);
        v = vset_lane_u16(m_fromLinear[gidx], v, 1);
        v = vset_lane_u16(m_fromLinear[bidx], v, 0);
        uint8x8_t v8 = vrshrn_n_u16(vcombine_u16(v, v), 8);
        return vget_lane_u32(vreinterpret_u32_u8(v8), 0);
#else
        uint a = rgb64.alpha();
        uint r = rgb64.red();
        uint g = rgb64.green();
        uint b = rgb64.blue();
        a = a - (a >> 8);
        r = r - (r >> 8);
        g = g - (g >> 8);
        b = b - (b >> 8);
        a = (a + 0x80) >> 8;
        r = (m_fromLinear[r >> ShiftDown] + 0x80) >> 8;
        g = (m_fromLinear[g >> ShiftDown] + 0x80) >> 8;
        b = (m_fromLinear[b >> ShiftDown] + 0x80) >> 8;
        return (a << 24) | (r << 16) | (g << 8) | b;
#endif
    }